

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam.cpp
# Opt level: O1

void InitUndistortRectifyMap(Mat *K,Mat *D,Mat *xi,Mat *R,Mat *P,Size *size,Mat *map1,Mat *map2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  Mat KRi;
  int local_480;
  int local_47c;
  int local_478;
  int local_474;
  Mat local_470 [96];
  Mat local_410 [16];
  long local_400;
  long *local_3c8;
  Mat local_3b0 [16];
  long local_3a0;
  long *local_368;
  long *local_350 [2];
  Mat local_340 [96];
  Mat local_2e0 [96];
  Mat aMStack_280 [144];
  Mat local_1f0 [16];
  double *local_1e0;
  Mat local_190 [16];
  Mat local_180 [96];
  Mat local_120 [96];
  Mat aMStack_c0 [144];
  
  local_478 = size->width;
  local_474 = size->height;
  cv::Mat::Mat((Mat *)local_350,&local_478,5);
  cv::Mat::operator=(map1,(Mat *)local_350);
  cv::Mat::~Mat((Mat *)local_350);
  local_480 = size->width;
  local_47c = size->height;
  cv::Mat::Mat((Mat *)local_350,&local_480,5);
  cv::Mat::operator=(map2,(Mat *)local_350);
  cv::Mat::~Mat((Mat *)local_350);
  pdVar11 = *(double **)(K + 0x10);
  dVar1 = *pdVar11;
  dVar2 = pdVar11[1];
  dVar3 = *(double *)((long)pdVar11 + **(long **)(K + 0x48) + 8);
  dVar4 = *(double *)((long)pdVar11 + **(long **)(K + 0x48) + 0x10);
  dVar5 = pdVar11[2];
  dVar6 = **(double **)(xi + 0x10);
  pdVar11 = *(double **)(D + 0x10);
  dVar7 = *pdVar11;
  dVar8 = pdVar11[1];
  dVar9 = pdVar11[2];
  dVar10 = pdVar11[3];
  cv::operator*(local_190,P);
  cv::MatExpr::inv((int)local_350);
  cv::Mat::Mat(local_470);
  (**(code **)(*local_350[0] + 0x18))(local_350[0],local_350,local_470,0xffffffff);
  cv::Mat::~Mat(aMStack_280);
  cv::Mat::~Mat(local_2e0);
  cv::Mat::~Mat(local_340);
  cv::Mat::~Mat(aMStack_c0);
  cv::Mat::~Mat(local_120);
  cv::Mat::~Mat(local_180);
  if (0 < size->height) {
    lVar14 = 0;
    do {
      if (0 < size->width) {
        dVar15 = (double)(int)lVar14;
        lVar13 = 0;
        do {
          cv::Mat::Mat(local_1f0,local_470);
          dVar19 = (double)(int)lVar13;
          dVar18 = *local_1e0 * dVar19 + local_1e0[1] * dVar15 + local_1e0[2];
          cv::Mat::~Mat(local_1f0);
          cv::Mat::Mat(local_3b0,local_470);
          lVar12 = *local_368;
          dVar17 = *(double *)(local_3a0 + lVar12);
          dVar20 = *(double *)(local_3a0 + 8 + lVar12);
          dVar16 = *(double *)(local_3a0 + 0x10 + lVar12);
          cv::Mat::~Mat(local_3b0);
          cv::Mat::Mat(local_410,local_470);
          dVar16 = dVar16 + dVar17 * dVar19 + dVar20 * dVar15;
          lVar12 = *local_3c8;
          dVar20 = dVar19 * *(double *)(local_400 + lVar12 * 2) +
                   *(double *)(local_400 + 8 + lVar12 * 2) * dVar15 +
                   *(double *)(local_400 + 0x10 + lVar12 * 2);
          cv::Mat::~Mat(local_410);
          dVar17 = dVar20 * dVar20 + dVar18 * dVar18 + dVar16 * dVar16;
          if (dVar17 < 0.0) {
            dVar17 = sqrt(dVar17);
          }
          else {
            dVar17 = SQRT(dVar17);
          }
          dVar20 = dVar20 / dVar17 + dVar6;
          dVar19 = (dVar18 / dVar17) / dVar20;
          dVar20 = (dVar16 / dVar17) / dVar20;
          dVar16 = dVar19 * dVar19 + dVar20 * dVar20;
          dVar17 = dVar7 * dVar16 + 1.0 + dVar16 * dVar16 * dVar8;
          dVar18 = ((dVar20 + dVar20) * dVar20 + dVar16) * dVar9 +
                   dVar17 * dVar20 + dVar19 * (dVar10 + dVar10) * dVar20;
          *(float *)(**(long **)(map1 + 0x48) * lVar14 + *(long *)(map1 + 0x10) + lVar13 * 4) =
               (float)(dVar2 * dVar18 +
                       (((dVar19 + dVar19) * dVar19 + dVar16) * dVar10 +
                       dVar17 * dVar19 + (dVar9 + dVar9) * dVar19 * dVar20) * dVar1 + dVar5);
          *(float *)(**(long **)(map2 + 0x48) * lVar14 + *(long *)(map2 + 0x10) + lVar13 * 4) =
               (float)(dVar18 * dVar3 + dVar4);
          lVar13 = lVar13 + 1;
        } while (lVar13 < size->width);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < size->height);
  }
  cv::Mat::~Mat(local_470);
  return;
}

Assistant:

void InitUndistortRectifyMap(cv::Mat K, cv::Mat D, cv::Mat xi, cv::Mat R,
                             cv::Mat P, cv::Size size,
                             cv::Mat& map1, cv::Mat& map2) {
  map1 = cv::Mat(size, CV_32F);
  map2 = cv::Mat(size, CV_32F);

  double fx = K.at<double>(0,0);
  double fy = K.at<double>(1,1);
  double cx = K.at<double>(0,2);
  double cy = K.at<double>(1,2);
  double s  = K.at<double>(0,1);

  double xid = xi.at<double>(0,0);

  double k1 = D.at<double>(0,0);
  double k2 = D.at<double>(0,1);
  double p1 = D.at<double>(0,2);
  double p2 = D.at<double>(0,3);

  cv::Mat KRi = (P * R).inv();

  for (int r = 0; r < size.height; ++r) {
    for (int c = 0; c < size.width; ++c) {
      double xc = MatRowMul(KRi, c, r, 1., 0);
      double yc = MatRowMul(KRi, c, r, 1., 1);
      double zc = MatRowMul(KRi, c, r, 1., 2);

      double rr = sqrt(xc * xc + yc * yc + zc * zc);
      double xs = xc / rr;
      double ys = yc / rr;
      double zs = zc / rr;

      double xu = xs / (zs + xid);
      double yu = ys / (zs + xid);

      double r2 = xu * xu + yu * yu;
      double r4 = r2 * r2;
      double xd = (1+k1*r2+k2*r4)*xu + 2*p1*xu*yu + p2*(r2+2*xu*xu);
      double yd = (1+k1*r2+k2*r4)*yu + 2*p2*xu*yu + p1*(r2+2*yu*yu);

      double u = fx * xd + s * yd + cx;
      double v = fy * yd + cy;

      map1.at<float>(r,c) = (float) u;
      map2.at<float>(r,c) = (float) v;
    }
  }
}